

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O0

int ion_map_fd(int fd,ion_user_handle_t handle,int *map_fd)

{
  ion_user_handle_t local_2c;
  int local_28;
  ion_fd_data data;
  int ret;
  int *map_fd_local;
  ion_user_handle_t handle_local;
  int fd_local;
  
  local_28 = 0;
  if (map_fd == (int *)0x0) {
    handle_local = -0x16;
  }
  else {
    local_2c = handle;
    unique0x10000066 = map_fd;
    data.handle = ion_ioctl(fd,-0x3ff7b6fe,&local_2c);
    handle_local = data.handle;
    if (-1 < data.handle) {
      *stack0xffffffffffffffe0 = local_28;
      if (*stack0xffffffffffffffe0 < 0) {
        _mpp_log_l(2,"mpp_ion","map ioctl returned negative fd\n",(char *)0x0);
        handle_local = -0x16;
      }
      else {
        handle_local = 0;
      }
    }
  }
  return handle_local;
}

Assistant:

static int ion_map_fd(int fd, ion_user_handle_t handle, int *map_fd)
{
    int ret;
    struct ion_fd_data data = {
        .handle = handle,
    };

    if (map_fd == NULL)
        return -EINVAL;

    ret = ion_ioctl(fd, ION_IOC_MAP, &data);
    if (ret < 0)
        return ret;

    *map_fd = data.fd;
    if (*map_fd < 0) {
        mpp_err("map ioctl returned negative fd\n");
        return -EINVAL;
    }

    return 0;
}